

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O2

void __thiscall randomx::Instruction::h_ISTORE(Instruction *this,ostream *os)

{
  byte bVar1;
  ostream *poVar2;
  
  bVar1 = this->src;
  genAddressRegDst(this,os,this->dst & 7);
  poVar2 = std::operator<<(os,", r");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,bVar1 & 7);
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void  Instruction::h_ISTORE(std::ostream& os) const {
		auto dstIndex = dst % RegistersCount;
		auto srcIndex = src % RegistersCount;
		genAddressRegDst(os, dstIndex);
		os << ", r" << srcIndex << std::endl;
	}